

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip6.c
# Opt level: O2

Curl_addrinfo * Curl_getaddrinfo(Curl_easy *data,char *hostname,int port,int *waitp)

{
  _Bool _Var1;
  int iVar2;
  connectdata *pcVar3;
  uint uVar4;
  char *buffer;
  Curl_addrinfo *res;
  addrinfo hints;
  char sbuf [12];
  char addrbuf [128];
  
  *waitp = 0;
  pcVar3 = data->conn;
  if (pcVar3->ip_version == '\x01') {
    uVar4 = 2;
  }
  else {
    _Var1 = Curl_ipv6works(data);
    uVar4 = (uint)!_Var1 * 2;
    pcVar3 = data->conn;
  }
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints._0_8_ = (ulong)uVar4 << 0x20;
  hints.ai_protocol = 0;
  hints.ai_socktype = (pcVar3->transport != '\x03') + 1;
  iVar2 = inet_pton(2,hostname,addrbuf);
  if ((iVar2 == 1) || (iVar2 = inet_pton(10,hostname,addrbuf), iVar2 == 1)) {
    hints.ai_flags = 4;
  }
  if (port == 0) {
    buffer = (char *)0x0;
  }
  else {
    buffer = sbuf;
    curl_msnprintf(buffer,0xc,"%d",(ulong)(uint)port);
  }
  iVar2 = Curl_getaddrinfo_ex(hostname,buffer,&hints,&res);
  if (iVar2 != 0) {
    if (((data->set).field_0x8bd & 0x10) == 0) {
      res = (Curl_addrinfo *)0x0;
    }
    else {
      Curl_infof(data,"getaddrinfo(3) failed for %s:%d",hostname,(ulong)(uint)port);
      res = (Curl_addrinfo *)0x0;
    }
  }
  return res;
}

Assistant:

struct Curl_addrinfo *Curl_getaddrinfo(struct Curl_easy *data,
                                       const char *hostname,
                                       int port,
                                       int *waitp)
{
  struct addrinfo hints;
  struct Curl_addrinfo *res;
  int error;
  char sbuf[12];
  char *sbufptr = NULL;
#ifndef USE_RESOLVE_ON_IPS
  char addrbuf[128];
#endif
  int pf = PF_INET;

  *waitp = 0; /* synchronous response only */

  if((data->conn->ip_version != CURL_IPRESOLVE_V4) && Curl_ipv6works(data))
    /* The stack seems to be IPv6-enabled */
    pf = PF_UNSPEC;

  memset(&hints, 0, sizeof(hints));
  hints.ai_family = pf;
  hints.ai_socktype = (data->conn->transport == TRNSPRT_TCP) ?
    SOCK_STREAM : SOCK_DGRAM;

#ifndef USE_RESOLVE_ON_IPS
  /*
   * The AI_NUMERICHOST must not be set to get synthesized IPv6 address from
   * an IPv4 address on iOS and Mac OS X.
   */
  if((1 == Curl_inet_pton(AF_INET, hostname, addrbuf)) ||
     (1 == Curl_inet_pton(AF_INET6, hostname, addrbuf))) {
    /* the given address is numerical only, prevent a reverse lookup */
    hints.ai_flags = AI_NUMERICHOST;
  }
#endif

  if(port) {
    msnprintf(sbuf, sizeof(sbuf), "%d", port);
    sbufptr = sbuf;
  }

  error = Curl_getaddrinfo_ex(hostname, sbufptr, &hints, &res);
  if(error) {
    infof(data, "getaddrinfo(3) failed for %s:%d", hostname, port);
    return NULL;
  }

  if(port) {
    Curl_addrinfo_set_port(res, port);
  }

  dump_addrinfo(res);

  return res;
}